

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_unlink(lyd_node *node)

{
  ly_bool lVar1;
  lyd_node *local_18;
  lyd_node *leader;
  lyd_node *node_local;
  
  if (node != (lyd_node *)0x0) {
    leader = node;
    lVar1 = lyds_is_supported(node);
    if (lVar1 != '\0') {
      if ((leader->prev->next == (lyd_node *)0x0) || (leader->prev->schema != leader->schema)) {
        local_18 = leader;
      }
      else {
        lyd_find_sibling_val(leader,leader->schema,(char *)0x0,0,&local_18);
        if (local_18 == (lyd_node *)0x0) {
          __assert_fail("leader",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                        ,0x4c1,"void lyd_unlink(struct lyd_node *)");
        }
      }
      lyds_unlink(&local_18,leader);
    }
    lyd_unlink_ignore_lyds((lyd_node **)0x0,leader);
  }
  return;
}

Assistant:

void
lyd_unlink(struct lyd_node *node)
{
    struct lyd_node *leader;

    if (!node) {
        return;
    }

    /* unlink from the lyds tree */
    if (lyds_is_supported(node)) {
        if (!node->prev->next || (node->prev->schema != node->schema)) {
            leader = node;
        } else {
            lyd_find_sibling_val(node, node->schema, NULL, 0, &leader);
            assert(leader);
        }
        lyds_unlink(&leader, node);
    }

    /* unlink data tree */
    lyd_unlink_ignore_lyds(NULL, node);
}